

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O1

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CVSyncCommand>
          (CCommandBuffer *this,CVSyncCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  CCommand *pCVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  CCommand *pCVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar9 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar10 = (uVar1 - uVar9) + 0x28;
  if ((this->m_CmdBuffer).m_Size < uVar10) {
    pCVar8 = (CCommand *)0x0;
  }
  else {
    pCVar8 = (CCommand *)(puVar2 + (uVar1 - uVar9) + 8);
    (this->m_CmdBuffer).m_Used = (uint)uVar10;
  }
  if (pCVar8 != (CCommand *)0x0) {
    uVar5 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar3 = (Command->super_CCommand).m_pNext;
    iVar6 = Command->m_VSync;
    uVar7 = *(undefined4 *)&Command->field_0x14;
    pCVar4 = (CCommand *)Command->m_pRetOk;
    pCVar8->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar8->field_0x4 = uVar5;
    pCVar8->m_pNext = pCVar3;
    pCVar8[1].m_Cmd = iVar6;
    *(undefined4 *)&pCVar8[1].field_0x4 = uVar7;
    pCVar8[1].m_pNext = pCVar4;
    pCVar8->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar8;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar8;
    }
    this->m_pCmdBufferTail = pCVar8;
  }
  return pCVar8 != (CCommand *)0x0;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}